

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

type __thiscall
nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
operator=(optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *this,
         optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *other)

{
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->contained);
      this->has_value_ = false;
      return this;
    }
  }
  else {
    if (other->has_value_ == true) {
      optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
      initialize<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)this,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&other->contained);
      return this;
    }
    if (this->has_value_ == false) {
      return this;
    }
  }
  if (other->has_value_ == true) {
    tinyusdz::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::_M_move_assign
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->contained,
               &other->contained);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }